

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

TZDBNames * icu_63::TZDBTimeZoneNames::getMetaZoneNames(UnicodeString *mzID,UErrorCode *status)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  TZDBNames *pTVar4;
  UResourceBundle *pUVar5;
  TZDBNames *pTVar6;
  UChar *key_00;
  UChar mzIDKey [129];
  char key [129];
  Char16Ptr local_1d0;
  char16_t *local_1c8;
  char16_t local_1b8 [136];
  char local_a8 [136];
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((gTZDBNamesMapInitOnce == 2) ||
       (UVar2 = umtx_initImplPreInit((UInitOnce *)&gTZDBNamesMapInitOnce), UVar2 == '\0')) {
      if (U_ZERO_ERROR < DAT_00491f64) {
        *status = DAT_00491f64;
      }
    }
    else {
      gTZDBNamesMap =
           uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        uhash_setValueDeleter_63(gTZDBNamesMap,deleteTZDBNames);
        ucln_i18n_registerCleanup_63(UCLN_I18N_TZDBTIMEZONENAMES,tzdbTimeZoneNames_cleanup);
      }
      else {
        gTZDBNamesMap = (UHashtable *)0x0;
      }
      DAT_00491f64 = *status;
      umtx_initImplPostInit((UInitOnce *)&gTZDBNamesMapInitOnce);
    }
  }
  if (U_ZERO_ERROR < *status) {
    return (TZDBNames *)0x0;
  }
  local_1d0.p_ = local_1b8;
  icu_63::UnicodeString::extract(mzID,&local_1d0,0x81,status);
  local_1c8 = local_1d0.p_;
  sVar1 = (mzID->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (mzID->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  local_1b8[iVar3] = L'\0';
  umtx_lock_63((UMutex *)gTZDBNamesMapLock);
  pTVar4 = (TZDBNames *)uhash_get_63(gTZDBNamesMap,local_1b8);
  if (pTVar4 != (TZDBNames *)0x0) {
    pTVar6 = (TZDBNames *)0x0;
    if (pTVar4 != (TZDBNames *)"<empty>") {
      pTVar6 = pTVar4;
    }
    goto LAB_002865b3;
  }
  pUVar5 = ures_openDirect_63("icudt63l-zone","tzdbNames",status);
  pUVar5 = ures_getByKey_63(pUVar5,"zoneStrings",pUVar5,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    mergeTimeZoneKey(mzID,local_a8);
    pTVar6 = TZDBNames::createInstance(pUVar5,local_a8);
    key_00 = ZoneMeta::findMetaZoneID(mzID);
    if (key_00 == (UChar *)0x0) {
      if (pTVar6 != (TZDBNames *)0x0) goto LAB_0028659f;
      goto LAB_002865a8;
    }
    pTVar4 = (TZDBNames *)"<empty>";
    if (pTVar6 != (TZDBNames *)0x0) {
      pTVar4 = pTVar6;
    }
    uhash_put_63(gTZDBNamesMap,key_00,pTVar4,status);
    if ((pTVar6 != (TZDBNames *)0x0) && (U_ZERO_ERROR < *status)) {
LAB_0028659f:
      (*pTVar6->_vptr_TZDBNames[1])(pTVar6);
      goto LAB_002865a8;
    }
  }
  else {
LAB_002865a8:
    pTVar6 = (TZDBNames *)0x0;
  }
  ures_close_63(pUVar5);
LAB_002865b3:
  umtx_unlock_63((UMutex *)gTZDBNamesMapLock);
  return pTVar6;
}

Assistant:

const TZDBNames*
TZDBTimeZoneNames::getMetaZoneNames(const UnicodeString& mzID, UErrorCode& status) {
    umtx_initOnce(gTZDBNamesMapInitOnce, &initTZDBNamesMap, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    TZDBNames* tzdbNames = NULL;

    UChar mzIDKey[ZID_KEY_MAX + 1];
    mzID.extract(mzIDKey, ZID_KEY_MAX + 1, status);
    U_ASSERT(status == U_ZERO_ERROR);   // already checked length above
    mzIDKey[mzID.length()] = 0;

    umtx_lock(&gTZDBNamesMapLock);
    {
        void *cacheVal = uhash_get(gTZDBNamesMap, mzIDKey);
        if (cacheVal == NULL) {
            UResourceBundle *zoneStringsRes = ures_openDirect(U_ICUDATA_ZONE, "tzdbNames", &status);
            zoneStringsRes = ures_getByKey(zoneStringsRes, gZoneStrings, zoneStringsRes, &status);
            if (U_SUCCESS(status)) {
                char key[ZID_KEY_MAX + 1];
                mergeTimeZoneKey(mzID, key);
                tzdbNames = TZDBNames::createInstance(zoneStringsRes, key);

                if (tzdbNames == NULL) {
                    cacheVal = (void *)EMPTY;
                } else {
                    cacheVal = tzdbNames;
                }
                // Use the persistent ID as the resource key, so we can
                // avoid duplications.
                // TODO: Is there a more efficient way, like intern() in Java?
                void* newKey = (void*) ZoneMeta::findMetaZoneID(mzID);
                if (newKey != NULL) {
                    uhash_put(gTZDBNamesMap, newKey, cacheVal, &status);
                    if (U_FAILURE(status)) {
                        if (tzdbNames != NULL) {
                            delete tzdbNames;
                            tzdbNames = NULL;
                        }
                    }
                } else {
                    // Should never happen with a valid input
                    if (tzdbNames != NULL) {
                        // It's not possible that we get a valid tzdbNames with unknown ID.
                        // But just in case..
                        delete tzdbNames;
                        tzdbNames = NULL;
                    }
                }
            }
            ures_close(zoneStringsRes);
        } else if (cacheVal != EMPTY) {
            tzdbNames = (TZDBNames *)cacheVal;
        }
    }
    umtx_unlock(&gTZDBNamesMapLock);

    return tzdbNames;
}